

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O3

ssize_t fd_write(hFILE *fpv,void *buffer,size_t nbytes)

{
  long lVar1;
  int *piVar2;
  
  while( true ) {
    if (((ulong)fpv[1].buffer & 0x100000000) == 0) {
      lVar1 = write(*(int *)&fpv[1].buffer,buffer,nbytes);
    }
    else {
      lVar1 = send(*(int *)&fpv[1].buffer,buffer,nbytes,0);
    }
    if (-1 < lVar1) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      return lVar1;
    }
  }
  return lVar1;
}

Assistant:

static ssize_t fd_write(hFILE *fpv, const void *buffer, size_t nbytes)
{
    hFILE_fd *fp = (hFILE_fd *) fpv;
    ssize_t n;
    do {
        n = fp->is_socket?  send(fp->fd, buffer, nbytes, 0)
                         : write(fp->fd, buffer, nbytes);
    } while (n < 0 && errno == EINTR);
    return n;
}